

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cpp
# Opt level: O2

void __thiscall field3d<cellbe>::field3d(field3d<cellbe> *this,int nx0,int ny0,int nz0)

{
  unique_ptr<cellbe_**[],_std::default_delete<cellbe_**[]>_> *this_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined1 auVar4 [16];
  pointer __p_00;
  pointer __p_01;
  pointer __p_02;
  long lVar5;
  pointer __p;
  ulong uVar6;
  int iVar7;
  cellbe **ppcVar8;
  ulong uVar9;
  int iVar10;
  pointer __p_1;
  __uniq_ptr_impl<cellbe_**,_std::default_delete<cellbe_**[]>_> local_38;
  
  this->nx = nx0;
  this->ny = ny0;
  this->nz = nz0;
  (this->p3)._M_t.super___uniq_ptr_impl<cellbe,_std::default_delete<cellbe[]>_>._M_t.
  super__Tuple_impl<0UL,_cellbe_*,_std::default_delete<cellbe[]>_>.
  super__Head_base<0UL,_cellbe_*,_false>._M_head_impl = (cellbe *)0x0;
  this_00 = &this->p;
  (this->p)._M_t.super___uniq_ptr_impl<cellbe_**,_std::default_delete<cellbe_**[]>_>._M_t.
  super__Tuple_impl<0UL,_cellbe_***,_std::default_delete<cellbe_**[]>_>.
  super__Head_base<0UL,_cellbe_***,_false>._M_head_impl = (cellbe ***)0x0;
  (this->p2)._M_t.super___uniq_ptr_impl<cellbe_*,_std::default_delete<cellbe_*[]>_>._M_t.
  super__Tuple_impl<0UL,_cellbe_**,_std::default_delete<cellbe_*[]>_>.
  super__Head_base<0UL,_cellbe_**,_false>._M_head_impl = (cellbe **)0x0;
  uVar6 = (ulong)(uint)nx0 << 3;
  if (nx0 < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  __p_00 = (pointer)operator_new__(uVar6);
  memset(__p_00,0,uVar6);
  local_38._M_t.super__Tuple_impl<0UL,_cellbe_***,_std::default_delete<cellbe_**[]>_>.
  super__Head_base<0UL,_cellbe_***,_false>._M_head_impl =
       (tuple<cellbe_***,_std::default_delete<cellbe_**[]>_>)
       (_Tuple_impl<0UL,_cellbe_***,_std::default_delete<cellbe_**[]>_>)0x0;
  std::__uniq_ptr_impl<cellbe_**,_std::default_delete<cellbe_**[]>_>::reset
            ((__uniq_ptr_impl<cellbe_**,_std::default_delete<cellbe_**[]>_> *)this_00,__p_00);
  std::unique_ptr<cellbe_**[],_std::default_delete<cellbe_**[]>_>::~unique_ptr
            ((unique_ptr<cellbe_**[],_std::default_delete<cellbe_**[]>_> *)&local_38);
  lVar5 = (long)this->ny * (long)this->nx;
  uVar6 = lVar5 * 8;
  if ((int)lVar5 < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  __p_01 = (pointer)operator_new__(uVar6);
  lVar5 = 0;
  memset(__p_01,0,uVar6);
  local_38._M_t.super__Tuple_impl<0UL,_cellbe_***,_std::default_delete<cellbe_**[]>_>.
  super__Head_base<0UL,_cellbe_***,_false>._M_head_impl =
       (tuple<cellbe_***,_std::default_delete<cellbe_**[]>_>)
       (_Tuple_impl<0UL,_cellbe_***,_std::default_delete<cellbe_**[]>_>)0x0;
  std::__uniq_ptr_impl<cellbe_*,_std::default_delete<cellbe_*[]>_>::reset
            ((__uniq_ptr_impl<cellbe_*,_std::default_delete<cellbe_*[]>_> *)&this->p2,__p_01);
  std::unique_ptr<cellbe_*[],_std::default_delete<cellbe_*[]>_>::~unique_ptr
            ((unique_ptr<cellbe_*[],_std::default_delete<cellbe_*[]>_> *)&local_38);
  uVar1 = this->nx;
  iVar10 = this->ny;
  for (uVar6 = 0; (~((int)uVar1 >> 0x1f) & uVar1) != uVar6; uVar6 = uVar6 + 1) {
    ppcVar8 = (cellbe **)
              ((long)(this->p2)._M_t.
                     super___uniq_ptr_impl<cellbe_*,_std::default_delete<cellbe_*[]>_>._M_t.
                     super__Tuple_impl<0UL,_cellbe_**,_std::default_delete<cellbe_*[]>_>.
                     super__Head_base<0UL,_cellbe_**,_false>._M_head_impl + lVar5);
    lVar5 = lVar5 + (long)iVar10 * 8;
    (this_00->_M_t).super___uniq_ptr_impl<cellbe_**,_std::default_delete<cellbe_**[]>_>._M_t.
    super__Tuple_impl<0UL,_cellbe_***,_std::default_delete<cellbe_**[]>_>.
    super__Head_base<0UL,_cellbe_***,_false>._M_head_impl[uVar6] = ppcVar8;
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)this->nz * (long)iVar10 * (long)(int)uVar1;
  uVar6 = SUB168(auVar4 * ZEXT816(0x18),0);
  if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  __p_02 = (pointer)operator_new__(uVar6);
  iVar10 = 0;
  memset(__p_02,0,uVar6);
  local_38._M_t.super__Tuple_impl<0UL,_cellbe_***,_std::default_delete<cellbe_**[]>_>.
  super__Head_base<0UL,_cellbe_***,_false>._M_head_impl =
       (tuple<cellbe_***,_std::default_delete<cellbe_**[]>_>)
       (_Tuple_impl<0UL,_cellbe_***,_std::default_delete<cellbe_**[]>_>)0x0;
  std::__uniq_ptr_impl<cellbe,_std::default_delete<cellbe[]>_>::reset
            ((__uniq_ptr_impl<cellbe,_std::default_delete<cellbe[]>_> *)&this->p3,__p_02);
  std::unique_ptr<cellbe[],_std::default_delete<cellbe[]>_>::~unique_ptr
            ((unique_ptr<cellbe[],_std::default_delete<cellbe[]>_> *)&local_38);
  uVar1 = this->nx;
  uVar2 = this->ny;
  for (uVar6 = 0; uVar6 != (~((int)uVar1 >> 0x1f) & uVar1); uVar6 = uVar6 + 1) {
    iVar3 = this->nz;
    iVar7 = iVar3 * iVar10;
    for (uVar9 = 0; (~((int)uVar2 >> 0x1f) & uVar2) != uVar9; uVar9 = uVar9 + 1) {
      lVar5 = (long)iVar7;
      iVar7 = iVar7 + iVar3;
      (this_00->_M_t).super___uniq_ptr_impl<cellbe_**,_std::default_delete<cellbe_**[]>_>._M_t.
      super__Tuple_impl<0UL,_cellbe_***,_std::default_delete<cellbe_**[]>_>.
      super__Head_base<0UL,_cellbe_***,_false>._M_head_impl[uVar6][uVar9] =
           (this->p3)._M_t.super___uniq_ptr_impl<cellbe,_std::default_delete<cellbe[]>_>._M_t.
           super__Tuple_impl<0UL,_cellbe_*,_std::default_delete<cellbe[]>_>.
           super__Head_base<0UL,_cellbe_*,_false>._M_head_impl + lVar5;
    }
    iVar10 = iVar10 + uVar2;
  }
  return;
}

Assistant:

field3d<T>::field3d(int nx0, int ny0, int nz0) : nx(nx0), ny(ny0), nz(nz0) {

    p = std::unique_ptr<T**[]>(new T**[nx]());

    p2 = std::unique_ptr<T*[]>(new T*[nx * ny]());
    for(int i=0; i<nx; i++)
    {
        p[i] = &(p2[ny*i]);
    }

    p3 = std::unique_ptr<T[]>(new T[nx * ny * nz]());
    for(int i=0; i<nx; i++)
    {
        for(int j=0; j<ny; j++)
        {
            p[i][j] = &(p3[nz*ny*i + nz*j]);
        }
    }
}